

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::BVHNIntersector1<4,_16781328,_false,_embree::avx2::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char cVar10;
  AABBNodeMB4D *node1;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  NodeRef *pNVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined4 uVar21;
  ulong unaff_R15;
  vint4 ai_5;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vint4 ai_1;
  undefined1 auVar27 [16];
  vint4 ai_3;
  undefined1 auVar28 [16];
  float fVar29;
  vint4 ai;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 uVar33;
  vint4 ai_2;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_4;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vfloat4 a0;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vint4 bi_2;
  vint4 bi;
  Precalculations pre;
  NodeRef stack [244];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      aVar5 = (ray->dir).field_0.field_1;
      auVar38 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar22 = vrsqrtss_avx(auVar38,auVar38);
      fVar43 = auVar22._0_4_;
      pre.depth_scale = fVar43 * 1.5 - auVar38._0_4_ * 0.5 * fVar43 * fVar43 * fVar43;
      uVar2 = *(undefined4 *)&(ray->dir).field_0;
      auVar48._0_4_ = aVar5.x * pre.depth_scale;
      auVar48._4_4_ = aVar5.y * pre.depth_scale;
      auVar48._8_4_ = aVar5.z * pre.depth_scale;
      auVar48._12_4_ = aVar5.field_3.w * pre.depth_scale;
      auVar22 = vshufpd_avx(auVar48,auVar48,1);
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar38 = vmovshdup_avx(auVar48);
      auVar54._0_4_ = auVar38._0_4_ ^ 0x80000000;
      auVar39 = ZEXT816(0) << 0x40;
      auVar38 = vunpckhps_avx(auVar48,auVar39);
      auVar54._4_12_ = ZEXT812(0) << 0x20;
      auVar44 = vshufps_avx(auVar38,auVar54,0x41);
      auVar52._0_8_ = auVar22._0_8_ ^ 0x8000000080000000;
      auVar52._8_8_ = auVar22._8_8_ ^ auVar24._8_8_;
      auVar24 = vinsertps_avx(auVar52,auVar48,0x2a);
      auVar38 = vdpps_avx(auVar44,auVar44,0x7f);
      auVar22 = vdpps_avx(auVar24,auVar24,0x7f);
      auVar38 = vcmpps_avx(auVar22,auVar38,1);
      auVar55._0_4_ = auVar38._0_4_;
      auVar55._4_4_ = auVar55._0_4_;
      auVar55._8_4_ = auVar55._0_4_;
      auVar55._12_4_ = auVar55._0_4_;
      auVar38 = vblendvps_avx(auVar24,auVar44,auVar55);
      auVar22 = vdpps_avx(auVar38,auVar38,0x7f);
      uVar3 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar24 = vrsqrtss_avx(auVar22,auVar22);
      fVar29 = auVar24._0_4_;
      fVar43 = (ray->dir).field_0.m128[2];
      fVar29 = fVar29 * 1.5 - auVar22._0_4_ * 0.5 * fVar29 * fVar29 * fVar29;
      auVar53._0_4_ = auVar38._0_4_ * fVar29;
      auVar53._4_4_ = auVar38._4_4_ * fVar29;
      auVar53._8_4_ = auVar38._8_4_ * fVar29;
      auVar53._12_4_ = auVar38._12_4_ * fVar29;
      auVar38 = vshufps_avx(auVar53,auVar53,0xc9);
      auVar22 = vshufps_avx(auVar48,auVar48,0xc9);
      auVar56._0_4_ = auVar53._0_4_ * auVar22._0_4_;
      auVar56._4_4_ = auVar53._4_4_ * auVar22._4_4_;
      auVar56._8_4_ = auVar53._8_4_ * auVar22._8_4_;
      auVar56._12_4_ = auVar53._12_4_ * auVar22._12_4_;
      auVar38 = vfmsub231ps_fma(auVar56,auVar48,auVar38);
      auVar24 = vshufps_avx(auVar38,auVar38,0xc9);
      auVar38 = vdpps_avx(auVar24,auVar24,0x7f);
      auVar22 = vrsqrtss_avx(auVar38,auVar38);
      fVar29 = auVar22._0_4_;
      fVar29 = fVar29 * 1.5 - fVar29 * fVar29 * fVar29 * auVar38._0_4_ * 0.5;
      auVar34._0_4_ = auVar24._0_4_ * fVar29;
      auVar34._4_4_ = auVar24._4_4_ * fVar29;
      auVar34._8_4_ = auVar24._8_4_ * fVar29;
      auVar34._12_4_ = auVar24._12_4_ * fVar29;
      auVar38._0_4_ = pre.depth_scale * auVar48._0_4_;
      auVar38._4_4_ = pre.depth_scale * auVar48._4_4_;
      auVar38._8_4_ = pre.depth_scale * auVar48._8_4_;
      auVar38._12_4_ = pre.depth_scale * auVar48._12_4_;
      auVar24 = vunpcklps_avx(auVar53,auVar38);
      auVar38 = vunpckhps_avx(auVar53,auVar38);
      auVar44 = vunpcklps_avx(auVar34,auVar39);
      auVar22 = vunpckhps_avx(auVar34,auVar39);
      pre.ray_space.vz.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar38,auVar22);
      pre.ray_space.vx.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar24,auVar44);
      pre.ray_space.vy.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar24,auVar44);
      pNVar17 = stack + 1;
      auVar22 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar39._8_4_ = 0x7fffffff;
      auVar39._0_8_ = 0x7fffffff7fffffff;
      auVar39._12_4_ = 0x7fffffff;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar38 = vandps_avx((undefined1  [16])aVar5,auVar39);
      auVar44._8_4_ = 0x219392ef;
      auVar44._0_8_ = 0x219392ef219392ef;
      auVar44._12_4_ = 0x219392ef;
      auVar38 = vcmpps_avx(auVar38,auVar44,1);
      auVar38 = vblendvps_avx((undefined1  [16])aVar5,auVar44,auVar38);
      auVar24 = vrcpps_avx(auVar38);
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = &DAT_3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      auVar38 = vfnmadd213ps_fma(auVar38,auVar24,auVar45);
      auVar34 = vfmadd132ps_fma(auVar38,auVar24,auVar24);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      fVar29 = auVar34._0_4_;
      auVar49._4_4_ = fVar29;
      auVar49._0_4_ = fVar29;
      auVar49._8_4_ = fVar29;
      auVar49._12_4_ = fVar29;
      auVar38 = vmovshdup_avx(auVar34);
      auVar24 = vshufpd_avx(auVar34,auVar34,1);
      uVar18 = (ulong)(fVar29 < 0.0) * 0x10;
      auVar40._0_4_ = fVar29 * (ray->org).field_0.m128[0];
      auVar40._4_4_ = auVar34._4_4_ * (ray->org).field_0.m128[1];
      auVar40._8_4_ = auVar34._8_4_ * (ray->org).field_0.m128[2];
      auVar40._12_4_ = auVar34._12_4_ * (ray->org).field_0.m128[3];
      uVar19 = (ulong)(auVar38._0_4_ < 0.0) << 4 | 0x20;
      auVar38 = vshufps_avx(auVar40,auVar40,0x55);
      auVar44 = vshufps_avx(auVar40,auVar40,0xaa);
      uVar20 = CONCAT44(auVar40._0_4_,auVar40._0_4_);
      auVar51._0_8_ = uVar20 ^ 0x8000000080000000;
      auVar51._8_4_ = -auVar40._0_4_;
      auVar51._12_4_ = -auVar40._0_4_;
      auVar46._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
      auVar46._8_4_ = auVar38._8_4_ ^ 0x80000000;
      auVar46._12_4_ = auVar38._12_4_ ^ 0x80000000;
      auVar41._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
      auVar41._8_4_ = auVar44._8_4_ ^ 0x80000000;
      auVar41._12_4_ = auVar44._12_4_ ^ 0x80000000;
      auVar38 = vshufps_avx(auVar34,auVar34,0x55);
      auVar44 = vshufps_avx(auVar34,auVar34,0xaa);
      uVar20 = (ulong)(auVar24._0_4_ < 0.0) << 4 | 0x40;
      uVar33 = auVar22._0_4_;
      auVar57._4_4_ = uVar33;
      auVar57._0_4_ = uVar33;
      auVar57._8_4_ = uVar33;
      auVar57._12_4_ = uVar33;
      auVar59._4_4_ = fVar1;
      auVar59._0_4_ = fVar1;
      auVar59._8_4_ = fVar1;
      auVar59._12_4_ = fVar1;
      uVar33 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uVar21 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar22._4_4_ = uVar21;
      auVar22._0_4_ = uVar21;
      auVar22._8_4_ = uVar21;
      auVar22._12_4_ = uVar21;
      do {
        if (pNVar17 == stack) {
          return;
        }
        uVar13 = pNVar17[-1].ptr;
        pNVar17 = pNVar17 + -1;
        do {
          if ((uVar13 & 8) == 0) {
            fVar1 = (ray->dir).field_0.m128[3];
            uVar14 = (uint)uVar13 & 7;
            uVar11 = uVar13 & 0xfffffffffffffff0;
            if (uVar14 == 3) {
              auVar24 = *(undefined1 (*) [16])(uVar11 + 0x80);
              auVar34 = *(undefined1 (*) [16])(uVar11 + 0x90);
              auVar40 = *(undefined1 (*) [16])(uVar11 + 0xa0);
              fVar29 = 1.0 - fVar1;
              auVar50._0_4_ = fVar1 * *(float *)(uVar11 + 0xe0);
              auVar50._4_4_ = fVar1 * *(float *)(uVar11 + 0xe4);
              auVar50._8_4_ = fVar1 * *(float *)(uVar11 + 0xe8);
              auVar50._12_4_ = fVar1 * *(float *)(uVar11 + 0xec);
              auVar35._0_4_ = fVar43 * auVar24._0_4_;
              auVar35._4_4_ = fVar43 * auVar24._4_4_;
              auVar35._8_4_ = fVar43 * auVar24._8_4_;
              auVar35._12_4_ = fVar43 * auVar24._12_4_;
              auVar58._0_4_ = fVar43 * auVar34._0_4_;
              auVar58._4_4_ = fVar43 * auVar34._4_4_;
              auVar58._8_4_ = fVar43 * auVar34._8_4_;
              auVar58._12_4_ = fVar43 * auVar34._12_4_;
              auVar60._0_4_ = fVar43 * auVar40._0_4_;
              auVar60._4_4_ = fVar43 * auVar40._4_4_;
              auVar60._8_4_ = fVar43 * auVar40._8_4_;
              auVar60._12_4_ = fVar43 * auVar40._12_4_;
              auVar6._4_4_ = uVar3;
              auVar6._0_4_ = uVar3;
              auVar6._8_4_ = uVar3;
              auVar6._12_4_ = uVar3;
              auVar45 = vfmadd231ps_fma(auVar35,auVar6,*(undefined1 (*) [16])(uVar11 + 0x50));
              auVar48 = vfmadd231ps_fma(auVar58,auVar6,*(undefined1 (*) [16])(uVar11 + 0x60));
              auVar52 = vfmadd231ps_fma(auVar60,auVar6,*(undefined1 (*) [16])(uVar11 + 0x70));
              auVar7._4_4_ = uVar2;
              auVar7._0_4_ = uVar2;
              auVar7._8_4_ = uVar2;
              auVar7._12_4_ = uVar2;
              auVar53 = vfmadd231ps_fma(auVar45,auVar7,*(undefined1 (*) [16])(uVar11 + 0x20));
              auVar54 = vfmadd231ps_fma(auVar48,auVar7,*(undefined1 (*) [16])(uVar11 + 0x30));
              auVar55 = vfmadd231ps_fma(auVar52,auVar7,*(undefined1 (*) [16])(uVar11 + 0x40));
              auVar45 = vandps_avx(auVar53,auVar39);
              auVar61._8_4_ = 0x219392ef;
              auVar61._0_8_ = 0x219392ef219392ef;
              auVar61._12_4_ = 0x219392ef;
              auVar45 = vcmpps_avx(auVar45,auVar61,1);
              auVar48 = vblendvps_avx(auVar53,auVar61,auVar45);
              auVar45 = vandps_avx(auVar54,auVar39);
              auVar45 = vcmpps_avx(auVar45,auVar61,1);
              auVar52 = vblendvps_avx(auVar54,auVar61,auVar45);
              auVar45 = vandps_avx(auVar55,auVar39);
              auVar45 = vcmpps_avx(auVar45,auVar61,1);
              auVar45 = vblendvps_avx(auVar55,auVar61,auVar45);
              auVar25._4_4_ = fVar29;
              auVar25._0_4_ = fVar29;
              auVar25._8_4_ = fVar29;
              auVar25._12_4_ = fVar29;
              auVar62._0_4_ = fVar1 * *(float *)(uVar11 + 0xf0);
              auVar62._4_4_ = fVar1 * *(float *)(uVar11 + 0xf4);
              auVar62._8_4_ = fVar1 * *(float *)(uVar11 + 0xf8);
              auVar62._12_4_ = fVar1 * *(float *)(uVar11 + 0xfc);
              auVar30._0_12_ = ZEXT812(0);
              auVar30._12_4_ = 0;
              auVar56 = vfmadd231ps_fma(auVar50,auVar25,auVar30);
              auVar6 = vfmadd231ps_fma(auVar62,auVar25,auVar30);
              auVar63._0_4_ = fVar1 * *(float *)(uVar11 + 0x100);
              auVar63._4_4_ = fVar1 * *(float *)(uVar11 + 0x104);
              auVar63._8_4_ = fVar1 * *(float *)(uVar11 + 0x108);
              auVar63._12_4_ = fVar1 * *(float *)(uVar11 + 0x10c);
              auVar7 = vfmadd231ps_fma(auVar63,auVar25,auVar30);
              auVar31._0_4_ = fVar29 + fVar1 * *(float *)(uVar11 + 0x110);
              auVar31._4_4_ = fVar29 + fVar1 * *(float *)(uVar11 + 0x114);
              auVar31._8_4_ = fVar29 + fVar1 * *(float *)(uVar11 + 0x118);
              auVar31._12_4_ = fVar29 + fVar1 * *(float *)(uVar11 + 0x11c);
              auVar36._0_4_ = fVar29 + fVar1 * *(float *)(uVar11 + 0x120);
              auVar36._4_4_ = fVar29 + fVar1 * *(float *)(uVar11 + 0x124);
              auVar36._8_4_ = fVar29 + fVar1 * *(float *)(uVar11 + 0x128);
              auVar36._12_4_ = fVar29 + fVar1 * *(float *)(uVar11 + 300);
              auVar64._0_4_ = fVar1 * *(float *)(uVar11 + 0x130) + fVar29;
              auVar64._4_4_ = fVar1 * *(float *)(uVar11 + 0x134) + fVar29;
              auVar64._8_4_ = fVar1 * *(float *)(uVar11 + 0x138) + fVar29;
              auVar64._12_4_ = fVar1 * *(float *)(uVar11 + 0x13c) + fVar29;
              auVar53 = vrcpps_avx(auVar48);
              auVar47._8_4_ = 0x3f800000;
              auVar47._0_8_ = &DAT_3f8000003f800000;
              auVar47._12_4_ = 0x3f800000;
              auVar48 = vfnmadd213ps_fma(auVar48,auVar53,auVar47);
              auVar53 = vfmadd132ps_fma(auVar48,auVar53,auVar53);
              auVar48 = vrcpps_avx(auVar52);
              auVar52 = vfnmadd213ps_fma(auVar52,auVar48,auVar47);
              auVar54 = vfmadd132ps_fma(auVar52,auVar48,auVar48);
              auVar48 = vrcpps_avx(auVar45);
              auVar45 = vfnmadd213ps_fma(auVar45,auVar48,auVar47);
              auVar55 = vfmadd132ps_fma(auVar45,auVar48,auVar48);
              auVar24 = vfmadd213ps_fma(auVar24,auVar22,*(undefined1 (*) [16])(uVar11 + 0xb0));
              auVar8._4_4_ = uVar33;
              auVar8._0_4_ = uVar33;
              auVar8._8_4_ = uVar33;
              auVar8._12_4_ = uVar33;
              auVar45 = vfmadd231ps_fma(auVar24,auVar8,*(undefined1 (*) [16])(uVar11 + 0x50));
              auVar24 = vfmadd213ps_fma(auVar34,auVar22,*(undefined1 (*) [16])(uVar11 + 0xc0));
              auVar34 = vfmadd231ps_fma(auVar24,auVar8,*(undefined1 (*) [16])(uVar11 + 0x60));
              auVar24 = vfmadd213ps_fma(auVar40,auVar22,*(undefined1 (*) [16])(uVar11 + 0xd0));
              auVar24 = vfmadd231ps_fma(auVar24,auVar8,*(undefined1 (*) [16])(uVar11 + 0x70));
              auVar9._4_4_ = uVar4;
              auVar9._0_4_ = uVar4;
              auVar9._8_4_ = uVar4;
              auVar9._12_4_ = uVar4;
              auVar40 = vfmadd231ps_fma(auVar45,auVar9,*(undefined1 (*) [16])(uVar11 + 0x20));
              auVar45 = vfmadd231ps_fma(auVar34,auVar9,*(undefined1 (*) [16])(uVar11 + 0x30));
              auVar52 = vfmadd231ps_fma(auVar24,auVar9,*(undefined1 (*) [16])(uVar11 + 0x40));
              auVar24 = vsubps_avx(auVar56,auVar40);
              auVar34 = vsubps_avx(auVar31,auVar40);
              auVar40 = vsubps_avx(auVar6,auVar45);
              auVar45 = vsubps_avx(auVar36,auVar45);
              auVar48 = vsubps_avx(auVar7,auVar52);
              auVar52 = vsubps_avx(auVar64,auVar52);
              auVar26._0_4_ = auVar53._0_4_ * auVar24._0_4_;
              auVar26._4_4_ = auVar53._4_4_ * auVar24._4_4_;
              auVar26._8_4_ = auVar53._8_4_ * auVar24._8_4_;
              auVar26._12_4_ = auVar53._12_4_ * auVar24._12_4_;
              auVar28._0_4_ = auVar53._0_4_ * auVar34._0_4_;
              auVar28._4_4_ = auVar53._4_4_ * auVar34._4_4_;
              auVar28._8_4_ = auVar53._8_4_ * auVar34._8_4_;
              auVar28._12_4_ = auVar53._12_4_ * auVar34._12_4_;
              auVar32._0_4_ = auVar54._0_4_ * auVar40._0_4_;
              auVar32._4_4_ = auVar54._4_4_ * auVar40._4_4_;
              auVar32._8_4_ = auVar54._8_4_ * auVar40._8_4_;
              auVar32._12_4_ = auVar54._12_4_ * auVar40._12_4_;
              auVar37._0_4_ = auVar55._0_4_ * auVar48._0_4_;
              auVar37._4_4_ = auVar55._4_4_ * auVar48._4_4_;
              auVar37._8_4_ = auVar55._8_4_ * auVar48._8_4_;
              auVar37._12_4_ = auVar55._12_4_ * auVar48._12_4_;
              auVar27._0_4_ = auVar54._0_4_ * auVar45._0_4_;
              auVar27._4_4_ = auVar54._4_4_ * auVar45._4_4_;
              auVar27._8_4_ = auVar54._8_4_ * auVar45._8_4_;
              auVar27._12_4_ = auVar54._12_4_ * auVar45._12_4_;
              auVar42._0_4_ = auVar55._0_4_ * auVar52._0_4_;
              auVar42._4_4_ = auVar55._4_4_ * auVar52._4_4_;
              auVar42._8_4_ = auVar55._8_4_ * auVar52._8_4_;
              auVar42._12_4_ = auVar55._12_4_ * auVar52._12_4_;
              auVar24 = vpminsd_avx(auVar32,auVar27);
              auVar34 = vpminsd_avx(auVar37,auVar42);
              auVar24 = vmaxps_avx(auVar24,auVar34);
              auVar48 = vpminsd_avx(auVar26,auVar28);
              auVar45 = vpmaxsd_avx(auVar26,auVar28);
              auVar34 = vpmaxsd_avx(auVar32,auVar27);
              auVar40 = vpmaxsd_avx(auVar37,auVar42);
              auVar40 = vminps_avx(auVar34,auVar40);
              auVar34 = vmaxps_avx(auVar57,auVar48);
              auVar24 = vmaxps_avx(auVar34,auVar24);
              auVar34 = vminps_avx(auVar59,auVar45);
              auVar34 = vminps_avx(auVar34,auVar40);
              auVar24 = vcmpps_avx(auVar24,auVar34,2);
            }
            else {
              auVar23._4_4_ = fVar1;
              auVar23._0_4_ = fVar1;
              auVar23._8_4_ = fVar1;
              auVar23._12_4_ = fVar1;
              auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar18),auVar23,
                                        *(undefined1 (*) [16])(uVar11 + 0x20 + uVar18));
              auVar24 = vfmadd213ps_fma(auVar24,auVar49,auVar51);
              auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar19),auVar23,
                                        *(undefined1 (*) [16])(uVar11 + 0x20 + uVar19));
              auVar34 = vfmadd213ps_fma(auVar34,auVar38,auVar46);
              auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar20),auVar23,
                                        *(undefined1 (*) [16])(uVar11 + 0x20 + uVar20));
              auVar24 = vpmaxsd_avx(auVar24,auVar34);
              auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + (uVar18 ^ 0x10)),
                                        auVar23,*(undefined1 (*) [16])
                                                 (uVar11 + 0x20 + (uVar18 ^ 0x10)));
              auVar45 = vfmadd213ps_fma(auVar40,auVar44,auVar41);
              auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + (uVar19 ^ 0x10)),
                                        auVar23,*(undefined1 (*) [16])
                                                 (uVar11 + 0x20 + (uVar19 ^ 0x10)));
              auVar34 = vfmadd213ps_fma(auVar34,auVar49,auVar51);
              auVar40 = vfmadd213ps_fma(auVar40,auVar38,auVar46);
              auVar40 = vpminsd_avx(auVar34,auVar40);
              auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + (uVar20 ^ 0x10)),
                                        auVar23,*(undefined1 (*) [16])
                                                 (uVar11 + 0x20 + (uVar20 ^ 0x10)));
              auVar48 = vfmadd213ps_fma(auVar34,auVar44,auVar41);
              auVar34 = vpmaxsd_avx(auVar45,auVar57);
              auVar24 = vpmaxsd_avx(auVar24,auVar34);
              auVar34 = vpminsd_avx(auVar48,auVar59);
              auVar34 = vpminsd_avx(auVar40,auVar34);
              if (uVar14 == 6) {
                auVar34 = vcmpps_avx(auVar24,auVar34,2);
                auVar24 = vcmpps_avx(*(undefined1 (*) [16])(uVar11 + 0xe0),auVar23,2);
                auVar40 = vcmpps_avx(auVar23,*(undefined1 (*) [16])(uVar11 + 0xf0),1);
                auVar24 = vandps_avx(auVar24,auVar40);
                auVar24 = vandps_avx(auVar24,auVar34);
              }
              else {
                auVar24 = vcmpps_avx(auVar24,auVar34,2);
              }
              auVar24 = vpslld_avx(auVar24,0x1f);
            }
            uVar21 = vmovmskps_avx(auVar24);
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar21);
          }
          if ((uVar13 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar15 = 4;
            }
            else {
              uVar11 = uVar13 & 0xfffffffffffffff0;
              lVar16 = 0;
              for (uVar13 = unaff_R15; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
              {
                lVar16 = lVar16 + 1;
              }
              iVar15 = 0;
              for (uVar12 = unaff_R15 - 1 & unaff_R15; uVar13 = *(ulong *)(uVar11 + lVar16 * 8),
                  uVar12 != 0; uVar12 = uVar12 - 1 & uVar12) {
                pNVar17->ptr = uVar13;
                pNVar17 = pNVar17 + 1;
                lVar16 = 0;
                for (uVar13 = uVar12; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
                {
                  lVar16 = lVar16 + 1;
                }
              }
            }
          }
          else {
            iVar15 = 6;
          }
        } while (iVar15 == 0);
        if (iVar15 == 6) {
          cVar10 = (**(code **)((long)This->leafIntersector +
                               (ulong)*(byte *)(uVar13 & 0xfffffffffffffff0) * 0x40 + 8))
                             (&pre,ray,context);
          iVar15 = 0;
          if (cVar10 != '\0') {
            ray->tfar = -INFINITY;
            iVar15 = 3;
          }
        }
      } while (iVar15 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }